

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

RegEx * YAML::Exp::PlainScalar(void)

{
  int iVar1;
  RegEx *pRVar2;
  allocator local_12a;
  allocator local_129;
  RegEx local_128;
  RegEx local_108;
  string local_e8;
  RegEx local_c8;
  RegEx local_a8;
  string local_88;
  RegEx local_68;
  RegEx local_48;
  RegEx local_28;
  
  if (PlainScalar()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&PlainScalar()::e);
    if (iVar1 != 0) {
      pRVar2 = BlankOrBreak();
      std::__cxx11::string::string((string *)&local_88,",[]{}#&*!|>\'\"%@`",&local_129);
      RegEx::RegEx(&local_68,&local_88,REGEX_OR);
      operator|(&local_48,pRVar2,&local_68);
      std::__cxx11::string::string((string *)&local_e8,"-?:",&local_12a);
      RegEx::RegEx(&local_c8,&local_e8,REGEX_OR);
      pRVar2 = BlankOrBreak();
      RegEx::RegEx(&local_128);
      operator|(&local_108,pRVar2,&local_128);
      operator+(&local_a8,&local_c8,&local_108);
      operator|(&local_28,&local_48,&local_a8);
      operator!(&PlainScalar::e,&local_28);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_28.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_a8.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_108.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_128.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_c8.m_params);
      std::__cxx11::string::~string((string *)&local_e8);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_48.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_68.m_params);
      std::__cxx11::string::~string((string *)&local_88);
      __cxa_atexit(RegEx::~RegEx,&PlainScalar::e,&__dso_handle);
      __cxa_guard_release(&PlainScalar()::e);
    }
  }
  return &PlainScalar::e;
}

Assistant:

inline const RegEx& PlainScalar() {
  static const RegEx e =
      !(BlankOrBreak() | RegEx(",[]{}#&*!|>\'\"%@`", REGEX_OR) |
        (RegEx("-?:", REGEX_OR) + (BlankOrBreak() | RegEx())));
  return e;
}